

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventsProcessorTests.cpp
# Opt level: O3

void __thiscall
solitaire::events::
EventsProcessorTests_tryPullOutCardsFromTableauPileOnLeftButtonDownEventOnTopCard_Test::
~EventsProcessorTests_tryPullOutCardsFromTableauPileOnLeftButtonDownEventOnTopCard_Test
          (EventsProcessorTests_tryPullOutCardsFromTableauPileOnLeftButtonDownEventOnTopCard_Test
           *this)

{
  EventsProcessorTests::~EventsProcessorTests(&this->super_EventsProcessorTests);
  operator_delete(this,0xf20);
  return;
}

Assistant:

TEST_F(EventsProcessorTests,
       tryPullOutCardsFromTableauPileOnLeftButtonDownEventOnTopCard)
{
    expectEvent(mouseLeftButtonDownEvent);
    ignoreLeftButtonDownOnButtons();
    ignoreLeftButtonDownOnFoundationPilesFromFirstTo(foundationPilesCount);
    ignoreLeftButtonDownOnTableauPilesFromFirstTo(tableauPilesCount - 1);
    acceptLeftButtonDownOnTableauPileCard(
        lastTableauPileId, lastTableauPileCardIndex, mouseLeftButtonDownEvent);
    expectGetTableauPileAndItsCollider(lastTableauPileId);
    EXPECT_CALL(tableauPileMock, getCards()).WillOnce(ReturnRef(cards));
    EXPECT_CALL(tableauPileMock, isTopCardCovered()).WillOnce(Return(false));
    expectTryPullOutCardsFromTableauPile(
        mouseLeftButtonDownEvent, lastTableauPileId, lastTableauPileCardIndex, 1);
    expectEvent(Quit {});
    eventsProcessor.processEvents();
}